

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O0

EncodingResult<kj::String> *
kj::decodeCEscape(EncodingResult<kj::String> *__return_storage_ptr__,ArrayPtr<const_char> text)

{
  bool in_R8B;
  ArrayPtr<const_char> text_00;
  Array<char> local_88;
  String local_70;
  kj *local_58;
  char *pcStack_50;
  undefined1 local_40 [8];
  EncodingResult<kj::Array<unsigned_char>_> result;
  ArrayPtr<const_char> text_local;
  
  text_00.ptr = (char *)text.size_;
  local_58 = (kj *)text.ptr;
  text_00.size_ = 1;
  pcStack_50 = text_00.ptr;
  result._24_8_ = local_58;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_40,local_58,text_00,in_R8B)
  ;
  Array<unsigned_char>::releaseAsChars(&local_88,(Array<unsigned_char> *)local_40);
  String::String(&local_70,&local_88);
  EncodingResult<kj::String>::EncodingResult
            (__return_storage_ptr__,&local_70,
             (bool)((byte)result.super_Array<unsigned_char>.disposer & 1));
  String::~String(&local_70);
  Array<char>::~Array(&local_88);
  EncodingResult<kj::Array<unsigned_char>_>::~EncodingResult
            ((EncodingResult<kj::Array<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline EncodingResult<String> decodeCEscape(ArrayPtr<const char> text) {
  auto result = decodeBinaryCEscape(text, true);
  return { String(result.releaseAsChars()), result.hadErrors };
}